

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexer.cpp
# Opt level: O1

void build_dindex_recursive<IsoHPlane>
               (size_t curr_node,size_t n_terminal,size_t ncomb,size_t st,size_t end,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *node_indices,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *node_mappings,
               vector<double,_std::allocator<double>_> *node_distances,
               vector<double,_std::allocator<double>_> *node_depths,size_t curr_depth,
               vector<IsoHPlane,_std::allocator<IsoHPlane>_> *tree)

{
  pointer puVar1;
  pointer puVar2;
  pointer pdVar3;
  ulong uVar4;
  pointer pIVar5;
  unsigned_long uVar6;
  runtime_error *this;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  size_t local_168;
  size_t local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_168 = curr_depth;
  local_160 = curr_node;
  while( true ) {
    if (st < end) {
      puVar1 = (node_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      puVar2 = (node_mappings->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pdVar3 = (node_distances->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = st;
      do {
        uVar7 = uVar8 + 1;
        if (uVar8 < end) {
          uVar8 = puVar2[puVar1[uVar8]];
          uVar9 = uVar7;
          do {
            uVar4 = puVar2[puVar1[uVar9]];
            if (uVar8 < uVar4) {
              lVar10 = uVar4 + (ncomb - uVar8) +
                       ~(((n_terminal - uVar8) + -1) * (n_terminal - uVar8) >> 1);
            }
            else {
              lVar10 = ((uVar8 + ncomb) - uVar4) +
                       ~(((n_terminal - uVar4) + -1) * (n_terminal - uVar4) >> 1);
            }
            pdVar3[lVar10] = pdVar3[lVar10] + 1.0;
            uVar9 = uVar9 + 1;
          } while (uVar9 <= end);
        }
        uVar8 = uVar7;
      } while (uVar7 != end);
    }
    pIVar5 = (tree->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (pIVar5[local_160].hplane_left == 0) break;
    uVar8 = st;
    if (st <= end) {
      uVar7 = pIVar5[local_160].hplane_right;
      puVar1 = (node_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar9 = st;
      do {
        if (puVar1[uVar9] < uVar7) {
          uVar6 = puVar1[uVar8];
          puVar1[uVar8] = puVar1[uVar9];
          puVar1[uVar9] = uVar6;
          uVar8 = uVar8 + 1;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 <= end);
    }
    if (uVar8 == st) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Unexpected error in ","")
      ;
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,
                 "/workspace/llm4binary/github/license_c_cmakelists/david-cortes[P]isotree/src/indexer.cpp"
                 ,"");
      std::operator+(&local_b0,&local_f0,&local_110);
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,":","");
      std::operator+(&local_90,&local_b0,&local_130);
      std::__cxx11::to_string(&local_d0,0xc9);
      std::operator+(&local_70,&local_90,&local_d0);
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_150,
                 ". Please open an issue in GitHub with this information, indicating the installed version of \'isotree\'.\n"
                 ,"");
      std::operator+(&local_50,&local_70,&local_150);
      std::runtime_error::runtime_error(this,(string *)&local_50);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_168 = local_168 + 1;
    build_dindex_recursive<IsoHPlane>
              (pIVar5[local_160].hplane_left,n_terminal,ncomb,st,uVar8 - 1,node_indices,
               node_mappings,node_distances,node_depths,local_168,tree);
    local_160 = (tree->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                super__Vector_impl_data._M_start[local_160].hplane_right;
    st = uVar8;
  }
  (node_depths->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
  ._M_start[(node_mappings->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
            _M_impl.super__Vector_impl_data._M_start[local_160]] =
       ((double)CONCAT44(0x45300000,(int)(local_168 >> 0x20)) - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)local_168) - 4503599627370496.0);
  return;
}

Assistant:

void build_dindex_recursive
(
    const size_t curr_node,
    const size_t n_terminal, const size_t ncomb,
    const size_t st, const size_t end,
    std::vector<size_t> &restrict node_indices, /* array with all terminal indices in 'tree' */
    const std::vector<size_t> &restrict node_mappings, /* tree_index : terminal_index */
    std::vector<double> &restrict node_distances, /* indexed by terminal_index */
    std::vector<double> &restrict node_depths, /* indexed by terminal_index */
    size_t curr_depth,
    const std::vector<Node> &tree
)
{
    if (end > st)
    {
        size_t i, j;
        for (size_t el1 = st; el1 < end; el1++)
        {
            for (size_t el2 = el1 + 1; el2 <= end; el2++)
            {
                i = node_mappings[node_indices[el1]];
                j = node_mappings[node_indices[el2]];
                node_distances[ix_comb(i, j, n_terminal, ncomb)]++;
            }
        }
    }

    if (!is_terminal_node(tree[curr_node]))
    {
        const size_t delim = get_idx_tree_right(tree[curr_node]);
        size_t frontier = st;
        size_t temp;
        for (size_t ix = st; ix <= end; ix++)
        {
           if (node_indices[ix] < delim)
            {
                temp = node_indices[frontier];
                node_indices[frontier] = node_indices[ix];
                node_indices[ix] = temp;
                frontier++;
            }
        }

        if (unlikely(frontier == st)) unexpected_error();

        curr_depth++;
        build_dindex_recursive<Node>(get_idx_tree_left(tree[curr_node]),
                                     n_terminal, ncomb,
                                     st, frontier-1,
                                     node_indices,
                                     node_mappings,
                                     node_distances,
                                     node_depths,
                                     curr_depth,
                                     tree);
        build_dindex_recursive<Node>(get_idx_tree_right(tree[curr_node]),
                                     n_terminal, ncomb,
                                     frontier, end,
                                     node_indices,
                                     node_mappings,
                                     node_distances,
                                     node_depths,
                                     curr_depth,
                                     tree);
    }

    else
    {
        node_depths[node_mappings[curr_node]] = curr_depth;
    }
}